

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  int iVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  ulong uVar33;
  byte bVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  ulong unaff_R15;
  size_t mask;
  ulong uVar39;
  ulong uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined4 uVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar68 [64];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 in_ZMM8 [64];
  uint uVar77;
  uint uVar80;
  uint uVar81;
  uint uVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar86;
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  RTCFilterFunctionNArguments args;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2810 [16];
  ulong local_2800;
  ulong local_27f8;
  ulong local_27f0;
  ulong local_27e8;
  Scene *local_27e0;
  ulong local_27d8;
  ulong *local_27d0;
  long local_27c8;
  RTCFilterFunctionNArguments local_27c0;
  undefined1 local_2790 [16];
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  RTCHitN local_2750 [16];
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  undefined1 local_2720 [16];
  undefined4 local_2710;
  undefined4 uStack_270c;
  undefined4 uStack_2708;
  undefined4 uStack_2704;
  undefined1 local_2700 [16];
  undefined1 local_26f0 [16];
  uint local_26e0;
  uint uStack_26dc;
  uint uStack_26d8;
  uint uStack_26d4;
  uint uStack_26d0;
  uint uStack_26cc;
  uint uStack_26c8;
  uint uStack_26c4;
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0;
  size_t local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  
  local_27d0 = local_2390;
  local_23a0 = root.ptr;
  local_2398[0] = 0;
  auVar43 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar88 = ZEXT3264(auVar43);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar89 = ZEXT3264(auVar44);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar90 = ZEXT3264(auVar45);
  auVar41 = vmulss_avx512f(auVar43._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar42 = vmulss_avx512f(auVar44._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar59 = auVar41._0_4_;
  auVar44._4_4_ = uVar59;
  auVar44._0_4_ = uVar59;
  auVar44._8_4_ = uVar59;
  auVar44._12_4_ = uVar59;
  auVar44._16_4_ = uVar59;
  auVar44._20_4_ = uVar59;
  auVar44._24_4_ = uVar59;
  auVar44._28_4_ = uVar59;
  auVar46._0_4_ = auVar42._0_4_;
  auVar46._4_4_ = auVar46._0_4_;
  auVar46._8_4_ = auVar46._0_4_;
  auVar46._12_4_ = auVar46._0_4_;
  auVar46._16_4_ = auVar46._0_4_;
  auVar46._20_4_ = auVar46._0_4_;
  auVar46._24_4_ = auVar46._0_4_;
  auVar46._28_4_ = auVar46._0_4_;
  auVar41 = vmulss_avx512f(auVar45._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar59 = auVar41._0_4_;
  auVar45._4_4_ = uVar59;
  auVar45._0_4_ = uVar59;
  auVar45._8_4_ = uVar59;
  auVar45._12_4_ = uVar59;
  auVar45._16_4_ = uVar59;
  auVar45._20_4_ = uVar59;
  auVar45._24_4_ = uVar59;
  auVar45._28_4_ = uVar59;
  local_27e8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_27f0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_27f8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_27d8 = local_27e8 ^ 0x20;
  uVar37 = local_27f0 ^ 0x20;
  iVar31 = (tray->tfar).field_0.i[k];
  auVar62 = ZEXT3264(CONCAT428(iVar31,CONCAT424(iVar31,CONCAT420(iVar31,CONCAT416(iVar31,CONCAT412(
                                                  iVar31,CONCAT48(iVar31,CONCAT44(iVar31,iVar31)))))
                                               )));
  uVar36 = local_27f8 ^ 0x20;
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar91 = ZEXT3264(auVar43);
  auVar44 = vxorps_avx512vl(auVar44,auVar43);
  auVar92 = ZEXT3264(auVar44);
  auVar44 = vxorps_avx512vl(auVar46,auVar43);
  auVar93 = ZEXT3264(auVar44);
  auVar43 = vxorps_avx512vl(auVar45,auVar43);
  auVar94 = ZEXT3264(auVar43);
  auVar43 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar95 = ZEXT3264(auVar43);
  auVar41 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar96 = ZEXT1664(auVar41);
  auVar43 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
  auVar97 = ZEXT3264(auVar43);
  auVar43 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  auVar98 = ZEXT3264(auVar43);
  auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
  auVar99 = ZEXT1664(auVar41);
  auVar43 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
  auVar100 = ZEXT3264(auVar43);
  uVar40 = local_27d8;
  do {
    do {
      do {
        if (local_27d0 == &local_23a0) {
          return;
        }
        pfVar4 = (float *)(local_27d0 + -1);
        local_27d0 = local_27d0 + -2;
      } while (*(float *)(ray + k * 4 + 0x80) < *pfVar4);
      uVar39 = *local_27d0;
      do {
        if ((uVar39 & 8) == 0) {
          auVar43 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar39 + 0x40 + local_27e8),auVar92._0_32_,
                               auVar88._0_32_);
          auVar44 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar39 + 0x40 + local_27f0),auVar93._0_32_,
                               auVar89._0_32_);
          auVar43 = vpmaxsd_avx2(auVar43,auVar44);
          auVar44 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar39 + 0x40 + local_27f8),auVar94._0_32_,
                               auVar90._0_32_);
          auVar44 = vpmaxsd_avx512vl(auVar44,auVar95._0_32_);
          auVar43 = vpmaxsd_avx2(auVar43,auVar44);
          in_ZMM8 = ZEXT3264(auVar43);
          auVar44 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar39 + 0x40 + uVar40),auVar92._0_32_,
                               auVar88._0_32_);
          auVar45 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar39 + 0x40 + uVar37),auVar93._0_32_,
                               auVar89._0_32_);
          auVar44 = vpminsd_avx2(auVar44,auVar45);
          auVar45 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar39 + 0x40 + uVar36),auVar94._0_32_,
                               auVar90._0_32_);
          auVar45 = vpminsd_avx2(auVar45,auVar62._0_32_);
          auVar44 = vpminsd_avx2(auVar44,auVar45);
          uVar22 = vpcmpd_avx512vl(auVar43,auVar44,2);
          unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),(uint)(byte)uVar22);
        }
        if ((uVar39 & 8) == 0) {
          if (unaff_R15 == 0) {
            iVar31 = 4;
          }
          else {
            auVar43 = *(undefined1 (*) [32])(uVar39 & 0xfffffffffffffff0);
            auVar44 = ((undefined1 (*) [32])(uVar39 & 0xfffffffffffffff0))[1];
            auVar45 = vmovdqa64_avx512vl(auVar97._0_32_);
            auVar56 = in_ZMM8._0_32_;
            auVar45 = vpternlogd_avx512vl(auVar45,auVar56,auVar98._0_32_,0xf8);
            uVar39 = unaff_R15 & 0xffffffff;
            auVar46 = vpcompressd_avx512vl(auVar45);
            bVar12 = (bool)((byte)uVar39 & 1);
            auVar47._0_4_ = (uint)bVar12 * auVar46._0_4_ | (uint)!bVar12 * auVar45._0_4_;
            bVar12 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar47._4_4_ = (uint)bVar12 * auVar46._4_4_ | (uint)!bVar12 * auVar45._4_4_;
            bVar12 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar47._8_4_ = (uint)bVar12 * auVar46._8_4_ | (uint)!bVar12 * auVar45._8_4_;
            bVar12 = (bool)((byte)(uVar39 >> 3) & 1);
            auVar47._12_4_ = (uint)bVar12 * auVar46._12_4_ | (uint)!bVar12 * auVar45._12_4_;
            bVar12 = (bool)((byte)(uVar39 >> 4) & 1);
            auVar47._16_4_ = (uint)bVar12 * auVar46._16_4_ | (uint)!bVar12 * auVar45._16_4_;
            bVar12 = (bool)((byte)(uVar39 >> 5) & 1);
            auVar47._20_4_ = (uint)bVar12 * auVar46._20_4_ | (uint)!bVar12 * auVar45._20_4_;
            bVar12 = (bool)((byte)(uVar39 >> 6) & 1);
            auVar47._24_4_ = (uint)bVar12 * auVar46._24_4_ | (uint)!bVar12 * auVar45._24_4_;
            bVar12 = (bool)((byte)(uVar39 >> 7) & 1);
            auVar47._28_4_ = (uint)bVar12 * auVar46._28_4_ | (uint)!bVar12 * auVar45._28_4_;
            auVar45 = vpermt2q_avx512vl(auVar43,auVar47,auVar44);
            uVar39 = auVar45._0_8_;
            iVar30 = 0;
            uVar35 = unaff_R15 - 1 & unaff_R15;
            iVar31 = 0;
            if (uVar35 != 0) {
              auVar45 = vpshufd_avx2(auVar47,0x55);
              vpermt2q_avx512vl(auVar43,auVar45,auVar44);
              auVar46 = vpminsd_avx2(auVar47,auVar45);
              auVar45 = vpmaxsd_avx2(auVar47,auVar45);
              uVar35 = uVar35 - 1 & uVar35;
              iVar31 = iVar30;
              if (uVar35 == 0) {
                auVar46 = vpermi2q_avx512vl(auVar46,auVar43,auVar44);
                uVar39 = auVar46._0_8_;
                auVar43 = vpermt2q_avx512vl(auVar43,auVar45,auVar44);
                *local_27d0 = auVar43._0_8_;
                auVar43 = vpermd_avx2(auVar45,auVar56);
                *(int *)(local_27d0 + 1) = auVar43._0_4_;
                local_27d0 = local_27d0 + 2;
              }
              else {
                auVar50 = vpshufd_avx2(auVar47,0xaa);
                vpermt2q_avx512vl(auVar43,auVar50,auVar44);
                auVar51 = vpminsd_avx2(auVar46,auVar50);
                auVar46 = vpmaxsd_avx2(auVar46,auVar50);
                auVar50 = vpminsd_avx2(auVar45,auVar46);
                auVar45 = vpmaxsd_avx2(auVar45,auVar46);
                uVar35 = uVar35 - 1 & uVar35;
                if (uVar35 == 0) {
                  auVar46 = vpermi2q_avx512vl(auVar51,auVar43,auVar44);
                  uVar39 = auVar46._0_8_;
                  auVar46 = vpermt2q_avx512vl(auVar43,auVar45,auVar44);
                  *local_27d0 = auVar46._0_8_;
                  auVar45 = vpermd_avx2(auVar45,auVar56);
                  *(int *)(local_27d0 + 1) = auVar45._0_4_;
                  auVar43 = vpermt2q_avx512vl(auVar43,auVar50,auVar44);
                  local_27d0[2] = auVar43._0_8_;
                  auVar43 = vpermd_avx2(auVar50,auVar56);
                  *(int *)(local_27d0 + 3) = auVar43._0_4_;
                  local_27d0 = local_27d0 + 4;
                }
                else {
                  auVar46 = vpshufd_avx2(auVar47,0xff);
                  vpermt2q_avx512vl(auVar43,auVar46,auVar44);
                  auVar53 = vpminsd_avx2(auVar51,auVar46);
                  auVar46 = vpmaxsd_avx2(auVar51,auVar46);
                  auVar51 = vpminsd_avx2(auVar50,auVar46);
                  auVar46 = vpmaxsd_avx2(auVar50,auVar46);
                  auVar50 = vpminsd_avx2(auVar45,auVar46);
                  auVar45 = vpmaxsd_avx2(auVar45,auVar46);
                  uVar35 = uVar35 - 1 & uVar35;
                  if (uVar35 == 0) {
                    auVar46 = vpermi2q_avx512vl(auVar53,auVar43,auVar44);
                    uVar39 = auVar46._0_8_;
                    auVar46 = vpermt2q_avx512vl(auVar43,auVar45,auVar44);
                    *local_27d0 = auVar46._0_8_;
                    in_ZMM8 = ZEXT3264(auVar56);
                    auVar45 = vpermd_avx2(auVar45,auVar56);
                    *(int *)(local_27d0 + 1) = auVar45._0_4_;
                    auVar45 = vpermt2q_avx512vl(auVar43,auVar50,auVar44);
                    local_27d0[2] = auVar45._0_8_;
                    auVar45 = vpermd_avx2(auVar50,auVar56);
                    *(int *)(local_27d0 + 3) = auVar45._0_4_;
                    auVar43 = vpermt2q_avx512vl(auVar43,auVar51,auVar44);
                    local_27d0[4] = auVar43._0_8_;
                    auVar43 = vpermd_avx2(auVar51,auVar56);
                    *(int *)(local_27d0 + 5) = auVar43._0_4_;
                    local_27d0 = local_27d0 + 6;
                  }
                  else {
                    auVar52 = valignd_avx512vl(auVar47,auVar47,3);
                    auVar46 = vmovdqa64_avx512vl(auVar99._0_32_);
                    auVar47 = vpermt2d_avx512vl(auVar46,auVar100._0_32_,auVar53);
                    auVar46 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                    auVar47 = vpermt2d_avx512vl(auVar47,auVar46,auVar51);
                    auVar47 = vpermt2d_avx512vl(auVar47,auVar46,auVar50);
                    auVar46 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                    auVar45 = vpermt2d_avx512vl(auVar47,auVar46,auVar45);
                    auVar68 = ZEXT3264(auVar45);
                    uVar39 = uVar35;
                    do {
                      auVar46 = auVar68._0_32_;
                      auVar50._8_4_ = 1;
                      auVar50._0_8_ = 0x100000001;
                      auVar50._12_4_ = 1;
                      auVar50._16_4_ = 1;
                      auVar50._20_4_ = 1;
                      auVar50._24_4_ = 1;
                      auVar50._28_4_ = 1;
                      auVar45 = vpermd_avx2(auVar50,auVar52);
                      auVar52 = valignd_avx512vl(auVar52,auVar52,1);
                      vpermt2q_avx512vl(auVar43,auVar52,auVar44);
                      uVar39 = uVar39 - 1 & uVar39;
                      uVar22 = vpcmpd_avx512vl(auVar45,auVar46,5);
                      auVar45 = vpmaxsd_avx2(auVar45,auVar46);
                      bVar34 = (byte)uVar22 << 1;
                      auVar46 = valignd_avx512vl(auVar46,auVar46,7);
                      bVar12 = (bool)((byte)uVar22 & 1);
                      auVar51._4_4_ = (uint)bVar12 * auVar46._4_4_ | (uint)!bVar12 * auVar45._4_4_;
                      auVar51._0_4_ = auVar45._0_4_;
                      bVar12 = (bool)(bVar34 >> 2 & 1);
                      auVar51._8_4_ = (uint)bVar12 * auVar46._8_4_ | (uint)!bVar12 * auVar45._8_4_;
                      bVar12 = (bool)(bVar34 >> 3 & 1);
                      auVar51._12_4_ =
                           (uint)bVar12 * auVar46._12_4_ | (uint)!bVar12 * auVar45._12_4_;
                      bVar12 = (bool)(bVar34 >> 4 & 1);
                      auVar51._16_4_ =
                           (uint)bVar12 * auVar46._16_4_ | (uint)!bVar12 * auVar45._16_4_;
                      bVar12 = (bool)(bVar34 >> 5 & 1);
                      auVar51._20_4_ =
                           (uint)bVar12 * auVar46._20_4_ | (uint)!bVar12 * auVar45._20_4_;
                      bVar12 = (bool)(bVar34 >> 6 & 1);
                      auVar51._24_4_ =
                           (uint)bVar12 * auVar46._24_4_ | (uint)!bVar12 * auVar45._24_4_;
                      auVar51._28_4_ =
                           (uint)(bVar34 >> 7) * auVar46._28_4_ |
                           (uint)!(bool)(bVar34 >> 7) * auVar45._28_4_;
                      auVar68 = ZEXT3264(auVar51);
                    } while (uVar39 != 0);
                    lVar38 = POPCOUNT(uVar35) + 3;
                    do {
                      auVar45 = vpermi2q_avx512vl(auVar51,auVar43,auVar44);
                      *local_27d0 = auVar45._0_8_;
                      auVar46 = auVar68._0_32_;
                      auVar45 = vpermd_avx2(auVar46,auVar56);
                      *(int *)(local_27d0 + 1) = auVar45._0_4_;
                      auVar51 = valignd_avx512vl(auVar46,auVar46,1);
                      local_27d0 = local_27d0 + 2;
                      auVar68 = ZEXT3264(auVar51);
                      lVar38 = lVar38 + -1;
                    } while (lVar38 != 0);
                    auVar43 = vpermt2q_avx512vl(auVar43,auVar51,auVar44);
                    uVar39 = auVar43._0_8_;
                    in_ZMM8 = ZEXT3264(auVar56);
                  }
                }
              }
            }
          }
        }
        else {
          iVar31 = 6;
        }
      } while (iVar31 == 0);
    } while (iVar31 != 6);
    local_25c0 = in_ZMM8._0_32_;
    local_27c8 = (ulong)((uint)uVar39 & 0xf) - 8;
    if (local_27c8 != 0) {
      uVar39 = uVar39 & 0xfffffffffffffff0;
      lVar38 = 0;
      do {
        lVar32 = lVar38 * 0x60;
        local_27e0 = context->scene;
        ppfVar3 = (local_27e0->vertices).items;
        pfVar4 = ppfVar3[*(uint *)(uVar39 + 0x48 + lVar32)];
        auVar64._16_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar39 + 0x28 + lVar32));
        auVar64._0_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar39 + 8 + lVar32));
        pfVar5 = ppfVar3[*(uint *)(uVar39 + 0x40 + lVar32)];
        auVar66._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar39 + 0x20 + lVar32));
        auVar66._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar39 + lVar32));
        pfVar6 = ppfVar3[*(uint *)(uVar39 + 0x4c + lVar32)];
        auVar74._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar39 + 0x2c + lVar32));
        auVar74._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar39 + 0xc + lVar32));
        pfVar7 = ppfVar3[*(uint *)(uVar39 + 0x44 + lVar32)];
        auVar78._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar39 + 0x24 + lVar32));
        auVar78._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar39 + 4 + lVar32));
        lVar1 = uVar39 + 0x40 + lVar32;
        local_25a0 = *(undefined8 *)(lVar1 + 0x10);
        uStack_2598 = *(undefined8 *)(lVar1 + 0x18);
        uStack_2590 = local_25a0;
        uStack_2588 = uStack_2598;
        lVar1 = uVar39 + 0x50 + lVar32;
        local_2780 = *(undefined8 *)(lVar1 + 0x10);
        uStack_2778 = *(undefined8 *)(lVar1 + 0x18);
        auVar13 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar39 + 0x10 + lVar32)),
                                *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar39 + 0x18 + lVar32)));
        auVar41 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar39 + 0x10 + lVar32)),
                                *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar39 + 0x18 + lVar32)));
        auVar14 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar39 + 0x14 + lVar32)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar39 + 0x1c + lVar32)));
        auVar42 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar39 + 0x14 + lVar32)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar39 + 0x1c + lVar32)));
        auVar15 = vunpcklps_avx(auVar41,auVar42);
        auVar16 = vunpcklps_avx(auVar13,auVar14);
        auVar41 = vunpckhps_avx(auVar13,auVar14);
        auVar14 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar39 + 0x30 + lVar32)),
                                *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar39 + 0x38 + lVar32)));
        auVar42 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar39 + 0x30 + lVar32)),
                                *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar39 + 0x38 + lVar32)));
        auVar17 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar39 + 0x34 + lVar32)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar39 + 0x3c + lVar32)));
        auVar13 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar39 + 0x34 + lVar32)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar39 + 0x3c + lVar32)));
        auVar13 = vunpcklps_avx(auVar42,auVar13);
        auVar18 = vunpcklps_avx(auVar14,auVar17);
        auVar42 = vunpckhps_avx(auVar14,auVar17);
        uStack_2770 = local_2780;
        uStack_2768 = uStack_2778;
        auVar43 = vunpcklps_avx(auVar78,auVar74);
        auVar44 = vunpcklps_avx(auVar66,auVar64);
        auVar50 = vunpcklps_avx(auVar44,auVar43);
        auVar51 = vunpckhps_avx(auVar44,auVar43);
        auVar43 = vunpckhps_avx(auVar78,auVar74);
        auVar44 = vunpckhps_avx(auVar66,auVar64);
        auVar53 = vunpcklps_avx(auVar44,auVar43);
        auVar43._16_16_ = auVar16;
        auVar43._0_16_ = auVar16;
        auVar72._16_16_ = auVar41;
        auVar72._0_16_ = auVar41;
        auVar63._16_16_ = auVar15;
        auVar63._0_16_ = auVar15;
        auVar75._16_16_ = auVar18;
        auVar75._0_16_ = auVar18;
        auVar73._16_16_ = auVar42;
        auVar73._0_16_ = auVar42;
        auVar56._16_16_ = auVar13;
        auVar56._0_16_ = auVar13;
        auVar43 = vsubps_avx(auVar50,auVar43);
        auVar44 = vsubps_avx(auVar51,auVar72);
        auVar45 = vsubps_avx(auVar53,auVar63);
        auVar46 = vsubps_avx(auVar75,auVar50);
        auVar47 = vsubps_avx(auVar73,auVar51);
        auVar56 = vsubps_avx(auVar56,auVar53);
        auVar48._4_4_ = auVar44._4_4_ * auVar56._4_4_;
        auVar48._0_4_ = auVar44._0_4_ * auVar56._0_4_;
        auVar48._8_4_ = auVar44._8_4_ * auVar56._8_4_;
        auVar48._12_4_ = auVar44._12_4_ * auVar56._12_4_;
        auVar48._16_4_ = auVar44._16_4_ * auVar56._16_4_;
        auVar48._20_4_ = auVar44._20_4_ * auVar56._20_4_;
        auVar48._24_4_ = auVar44._24_4_ * auVar56._24_4_;
        auVar48._28_4_ = auVar13._12_4_;
        auVar42 = vfmsub231ps_fma(auVar48,auVar47,auVar45);
        auVar49._4_4_ = auVar45._4_4_ * auVar46._4_4_;
        auVar49._0_4_ = auVar45._0_4_ * auVar46._0_4_;
        auVar49._8_4_ = auVar45._8_4_ * auVar46._8_4_;
        auVar49._12_4_ = auVar45._12_4_ * auVar46._12_4_;
        auVar49._16_4_ = auVar45._16_4_ * auVar46._16_4_;
        auVar49._20_4_ = auVar45._20_4_ * auVar46._20_4_;
        auVar49._24_4_ = auVar45._24_4_ * auVar46._24_4_;
        auVar49._28_4_ = auVar15._12_4_;
        auVar13 = vfmsub231ps_fma(auVar49,auVar56,auVar43);
        auVar26._4_4_ = auVar43._4_4_ * auVar47._4_4_;
        auVar26._0_4_ = auVar43._0_4_ * auVar47._0_4_;
        auVar26._8_4_ = auVar43._8_4_ * auVar47._8_4_;
        auVar26._12_4_ = auVar43._12_4_ * auVar47._12_4_;
        auVar26._16_4_ = auVar43._16_4_ * auVar47._16_4_;
        auVar26._20_4_ = auVar43._20_4_ * auVar47._20_4_;
        auVar26._24_4_ = auVar43._24_4_ * auVar47._24_4_;
        auVar26._28_4_ = auVar16._12_4_;
        uVar59 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar79._4_4_ = uVar59;
        auVar79._0_4_ = uVar59;
        auVar79._8_4_ = uVar59;
        auVar79._12_4_ = uVar59;
        auVar79._16_4_ = uVar59;
        auVar79._20_4_ = uVar59;
        auVar79._24_4_ = uVar59;
        auVar79._28_4_ = uVar59;
        auVar48 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
        auVar49 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
        uVar59 = *(undefined4 *)(ray + k * 4);
        auVar52._4_4_ = uVar59;
        auVar52._0_4_ = uVar59;
        auVar52._8_4_ = uVar59;
        auVar52._12_4_ = uVar59;
        auVar52._16_4_ = uVar59;
        auVar52._20_4_ = uVar59;
        auVar52._24_4_ = uVar59;
        auVar52._28_4_ = uVar59;
        auVar50 = vsubps_avx512vl(auVar50,auVar52);
        auVar14 = vfmsub231ps_fma(auVar26,auVar46,auVar44);
        uVar59 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar54._4_4_ = uVar59;
        auVar54._0_4_ = uVar59;
        auVar54._8_4_ = uVar59;
        auVar54._12_4_ = uVar59;
        auVar54._16_4_ = uVar59;
        auVar54._20_4_ = uVar59;
        auVar54._24_4_ = uVar59;
        auVar54._28_4_ = uVar59;
        auVar51 = vsubps_avx512vl(auVar51,auVar54);
        uVar59 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar55._4_4_ = uVar59;
        auVar55._0_4_ = uVar59;
        auVar55._8_4_ = uVar59;
        auVar55._12_4_ = uVar59;
        auVar55._16_4_ = uVar59;
        auVar55._20_4_ = uVar59;
        auVar55._24_4_ = uVar59;
        auVar55._28_4_ = uVar59;
        auVar52 = vsubps_avx512vl(auVar53,auVar55);
        auVar53 = vmulps_avx512vl(auVar48,auVar52);
        auVar54 = vfmsub231ps_avx512vl(auVar53,auVar51,auVar49);
        auVar53 = vmulps_avx512vl(auVar49,auVar50);
        auVar15 = vfmsub231ps_fma(auVar53,auVar52,auVar79);
        auVar53 = vmulps_avx512vl(auVar79,auVar51);
        auVar55 = vfmsub231ps_avx512vl(auVar53,auVar50,auVar48);
        auVar53 = vmulps_avx512vl(ZEXT1632(auVar14),auVar49);
        auVar53 = vfmadd231ps_avx512vl(auVar53,ZEXT1632(auVar13),auVar48);
        local_2520 = vfmadd231ps_avx512vl(auVar53,ZEXT1632(auVar42),auVar79);
        auVar53._8_4_ = 0x7fffffff;
        auVar53._0_8_ = 0x7fffffff7fffffff;
        auVar53._12_4_ = 0x7fffffff;
        auVar53._16_4_ = 0x7fffffff;
        auVar53._20_4_ = 0x7fffffff;
        auVar53._24_4_ = 0x7fffffff;
        auVar53._28_4_ = 0x7fffffff;
        vandps_avx512vl(local_2520,auVar53);
        vandps_avx512vl(local_2520,auVar91._0_32_);
        auVar56 = vmulps_avx512vl(auVar56,auVar55);
        auVar41 = vfmadd231ps_fma(auVar56,ZEXT1632(auVar15),auVar47);
        auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar54,auVar46);
        uVar77 = local_2520._0_4_;
        local_2580._0_4_ = (float)(uVar77 ^ auVar41._0_4_);
        uVar80 = local_2520._4_4_;
        local_2580._4_4_ = (float)(uVar80 ^ auVar41._4_4_);
        uVar81 = local_2520._8_4_;
        local_2580._8_4_ = (float)(uVar81 ^ auVar41._8_4_);
        uVar82 = local_2520._12_4_;
        local_2580._12_4_ = (float)(uVar82 ^ auVar41._12_4_);
        fVar83 = local_2520._16_4_;
        local_2580._16_4_ = fVar83;
        fVar84 = local_2520._20_4_;
        local_2580._20_4_ = fVar84;
        fVar85 = local_2520._24_4_;
        local_2580._24_4_ = fVar85;
        fVar86 = local_2520._28_4_;
        local_2580._28_4_ = fVar86;
        auVar45 = vmulps_avx512vl(auVar45,auVar55);
        auVar41 = vfmadd231ps_fma(auVar45,auVar44,ZEXT1632(auVar15));
        auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar43,auVar54);
        local_2560._0_4_ = (float)(uVar77 ^ auVar41._0_4_);
        local_2560._4_4_ = (float)(uVar80 ^ auVar41._4_4_);
        local_2560._8_4_ = (float)(uVar81 ^ auVar41._8_4_);
        local_2560._12_4_ = (float)(uVar82 ^ auVar41._12_4_);
        local_2560._16_4_ = fVar83;
        local_2560._20_4_ = fVar84;
        local_2560._24_4_ = fVar85;
        local_2560._28_4_ = fVar86;
        uVar22 = vcmpps_avx512vl(local_2580,ZEXT832(0) << 0x20,5);
        uVar19 = vcmpps_avx512vl(local_2560,ZEXT832(0) << 0x20,5);
        uVar20 = vcmpps_avx512vl(local_2520,ZEXT832(0) << 0x20,4);
        auVar87._0_4_ = local_2580._0_4_ + local_2560._0_4_;
        auVar87._4_4_ = local_2580._4_4_ + local_2560._4_4_;
        auVar87._8_4_ = local_2580._8_4_ + local_2560._8_4_;
        auVar87._12_4_ = local_2580._12_4_ + local_2560._12_4_;
        auVar87._16_4_ = fVar83 + fVar83;
        auVar87._20_4_ = fVar84 + fVar84;
        auVar87._24_4_ = fVar85 + fVar85;
        auVar87._28_4_ = fVar86 + fVar86;
        uVar21 = vcmpps_avx512vl(auVar87,local_2520,2);
        local_24a0 = (byte)uVar22 & (byte)uVar19 & (byte)uVar20 & (byte)uVar21;
        if (local_24a0 != 0) {
          auVar27._4_4_ = auVar52._4_4_ * auVar14._4_4_;
          auVar27._0_4_ = auVar52._0_4_ * auVar14._0_4_;
          auVar27._8_4_ = auVar52._8_4_ * auVar14._8_4_;
          auVar27._12_4_ = auVar52._12_4_ * auVar14._12_4_;
          auVar27._16_4_ = auVar52._16_4_ * 0.0;
          auVar27._20_4_ = auVar52._20_4_ * 0.0;
          auVar27._24_4_ = auVar52._24_4_ * 0.0;
          auVar27._28_4_ = auVar52._28_4_;
          auVar41 = vfmadd213ps_fma(auVar51,ZEXT1632(auVar13),auVar27);
          auVar41 = vfmadd213ps_fma(auVar50,ZEXT1632(auVar42),ZEXT1632(auVar41));
          local_2540._0_4_ = (float)(uVar77 ^ auVar41._0_4_);
          local_2540._4_4_ = (float)(uVar80 ^ auVar41._4_4_);
          local_2540._8_4_ = (float)(uVar81 ^ auVar41._8_4_);
          local_2540._12_4_ = (float)(uVar82 ^ auVar41._12_4_);
          local_2540._16_4_ = fVar83;
          local_2540._20_4_ = fVar84;
          local_2540._24_4_ = fVar85;
          local_2540._28_4_ = fVar86;
          uVar59 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar23._4_4_ = uVar59;
          auVar23._0_4_ = uVar59;
          auVar23._8_4_ = uVar59;
          auVar23._12_4_ = uVar59;
          auVar23._16_4_ = uVar59;
          auVar23._20_4_ = uVar59;
          auVar23._24_4_ = uVar59;
          auVar23._28_4_ = uVar59;
          auVar43 = vmulps_avx512vl(local_2520,auVar23);
          uVar22 = vcmpps_avx512vl(auVar43,local_2540,1);
          uVar59 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar24._4_4_ = uVar59;
          auVar24._0_4_ = uVar59;
          auVar24._8_4_ = uVar59;
          auVar24._12_4_ = uVar59;
          auVar24._16_4_ = uVar59;
          auVar24._20_4_ = uVar59;
          auVar24._24_4_ = uVar59;
          auVar24._28_4_ = uVar59;
          auVar43 = vmulps_avx512vl(local_2520,auVar24);
          uVar19 = vcmpps_avx512vl(local_2540,auVar43,2);
          local_24a0 = (byte)uVar22 & (byte)uVar19 & local_24a0;
          uVar40 = (ulong)local_24a0;
          if (local_24a0 != 0) {
            local_2500 = ZEXT1632(auVar42);
            local_24e0 = ZEXT1632(auVar13);
            local_24c0 = ZEXT1632(auVar14);
            local_23c0 = 0xf0;
            auVar43 = vrcp14ps_avx512vl(local_2520);
            auVar76._8_4_ = 0x3f800000;
            auVar76._0_8_ = &DAT_3f8000003f800000;
            auVar76._12_4_ = 0x3f800000;
            auVar76._16_4_ = 0x3f800000;
            auVar76._20_4_ = 0x3f800000;
            auVar76._24_4_ = 0x3f800000;
            auVar76._28_4_ = 0x3f800000;
            auVar41 = vfnmadd213ps_fma(local_2520,auVar43,auVar76);
            auVar41 = vfmadd132ps_fma(ZEXT1632(auVar41),auVar43,auVar43);
            fVar65 = auVar41._0_4_;
            fVar69 = auVar41._4_4_;
            local_2440._4_4_ = fVar69 * local_2540._4_4_;
            local_2440._0_4_ = fVar65 * local_2540._0_4_;
            fVar70 = auVar41._8_4_;
            local_2440._8_4_ = fVar70 * local_2540._8_4_;
            fVar71 = auVar41._12_4_;
            local_2440._12_4_ = fVar71 * local_2540._12_4_;
            local_2440._16_4_ = fVar83 * 0.0;
            local_2440._20_4_ = fVar84 * 0.0;
            local_2440._24_4_ = fVar85 * 0.0;
            local_2440._28_4_ = auVar43._28_4_;
            auVar62 = ZEXT3264(local_2440);
            auVar28._4_4_ = fVar69 * local_2580._4_4_;
            auVar28._0_4_ = fVar65 * local_2580._0_4_;
            auVar28._8_4_ = fVar70 * local_2580._8_4_;
            auVar28._12_4_ = fVar71 * local_2580._12_4_;
            auVar28._16_4_ = fVar83 * 0.0;
            auVar28._20_4_ = fVar84 * 0.0;
            auVar28._24_4_ = fVar85 * 0.0;
            auVar28._28_4_ = fVar86;
            auVar43 = vminps_avx(auVar28,auVar76);
            auVar67._0_4_ = fVar65 * local_2560._0_4_;
            auVar67._4_4_ = fVar69 * local_2560._4_4_;
            auVar67._8_4_ = fVar70 * local_2560._8_4_;
            auVar67._12_4_ = fVar71 * local_2560._12_4_;
            auVar67._16_4_ = fVar83 * 0.0;
            auVar67._20_4_ = fVar84 * 0.0;
            auVar67._24_4_ = fVar85 * 0.0;
            auVar67._28_4_ = 0;
            auVar44 = vminps_avx(auVar67,auVar76);
            auVar45 = vsubps_avx(auVar76,auVar43);
            auVar46 = vsubps_avx(auVar76,auVar44);
            local_2460 = vblendps_avx(auVar44,auVar45,0xf0);
            local_2480 = vblendps_avx(auVar43,auVar46,0xf0);
            fVar83 = (float)DAT_02060940;
            local_2420._0_4_ = auVar42._0_4_ * fVar83;
            fVar84 = DAT_02060940._4_4_;
            local_2420._4_4_ = auVar42._4_4_ * fVar84;
            fVar85 = DAT_02060940._8_4_;
            local_2420._8_4_ = auVar42._8_4_ * fVar85;
            fVar86 = DAT_02060940._12_4_;
            local_2420._12_4_ = auVar42._12_4_ * fVar86;
            fVar65 = DAT_02060940._16_4_;
            local_2420._16_4_ = fVar65 * 0.0;
            fVar69 = DAT_02060940._20_4_;
            local_2420._20_4_ = fVar69 * 0.0;
            fVar70 = DAT_02060940._24_4_;
            local_2420._24_4_ = fVar70 * 0.0;
            local_2420._28_4_ = 0;
            local_2400._0_4_ = auVar13._0_4_ * fVar83;
            local_2400._4_4_ = auVar13._4_4_ * fVar84;
            local_2400._8_4_ = auVar13._8_4_ * fVar85;
            local_2400._12_4_ = auVar13._12_4_ * fVar86;
            local_2400._16_4_ = fVar65 * 0.0;
            local_2400._20_4_ = fVar69 * 0.0;
            local_2400._24_4_ = fVar70 * 0.0;
            local_2400._28_4_ = 0;
            local_23e0._4_4_ = auVar14._4_4_ * fVar84;
            local_23e0._0_4_ = auVar14._0_4_ * fVar83;
            local_23e0._8_4_ = auVar14._8_4_ * fVar85;
            local_23e0._12_4_ = auVar14._12_4_ * fVar86;
            local_23e0._16_4_ = fVar65 * 0.0;
            local_23e0._20_4_ = fVar69 * 0.0;
            local_23e0._24_4_ = fVar70 * 0.0;
            local_23e0._28_4_ = 0;
            auVar60._8_4_ = 0x7f800000;
            auVar60._0_8_ = 0x7f8000007f800000;
            auVar60._12_4_ = 0x7f800000;
            auVar60._16_4_ = 0x7f800000;
            auVar60._20_4_ = 0x7f800000;
            auVar60._24_4_ = 0x7f800000;
            auVar60._28_4_ = 0x7f800000;
            auVar43 = vblendmps_avx512vl(auVar60,local_2440);
            auVar57._0_4_ =
                 (uint)(local_24a0 & 1) * auVar43._0_4_ | (uint)!(bool)(local_24a0 & 1) * 0x7f800000
            ;
            bVar12 = (bool)(local_24a0 >> 1 & 1);
            auVar57._4_4_ = (uint)bVar12 * auVar43._4_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(local_24a0 >> 2 & 1);
            auVar57._8_4_ = (uint)bVar12 * auVar43._8_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(local_24a0 >> 3 & 1);
            auVar57._12_4_ = (uint)bVar12 * auVar43._12_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(local_24a0 >> 4 & 1);
            auVar57._16_4_ = (uint)bVar12 * auVar43._16_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(local_24a0 >> 5 & 1);
            auVar57._20_4_ = (uint)bVar12 * auVar43._20_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(local_24a0 >> 6 & 1);
            auVar57._24_4_ = (uint)bVar12 * auVar43._24_4_ | (uint)!bVar12 * 0x7f800000;
            auVar57._28_4_ =
                 (uint)(local_24a0 >> 7) * auVar43._28_4_ |
                 (uint)!(bool)(local_24a0 >> 7) * 0x7f800000;
            auVar43 = vshufps_avx(auVar57,auVar57,0xb1);
            auVar43 = vminps_avx(auVar57,auVar43);
            auVar44 = vshufpd_avx(auVar43,auVar43,5);
            auVar43 = vminps_avx(auVar43,auVar44);
            auVar44 = vpermpd_avx2(auVar43,0x4e);
            auVar43 = vminps_avx(auVar43,auVar44);
            uVar22 = vcmpps_avx512vl(auVar57,auVar43,0);
            bVar34 = (byte)uVar22 & local_24a0;
            do {
              uVar77 = (uint)uVar40;
              if (bVar34 != 0) {
                uVar77 = (uint)bVar34;
              }
              uVar80 = 0;
              for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
                uVar80 = uVar80 + 1;
              }
              local_2800._0_4_ = uVar80 & 0xff;
              uVar35 = (ulong)(uint)local_2800;
              uVar77 = *(uint *)((long)&local_25a0 + uVar35 * 4);
              pGVar8 = (local_27e0->geometries).items[uVar77].ptr;
              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                uVar40 = (ulong)(byte)(~(byte)(1 << (uVar80 & 0x1f)) & (byte)uVar40);
                bVar12 = true;
              }
              else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                      (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                bVar12 = false;
              }
              else {
                local_26c0 = auVar62._0_32_;
                local_26a0 = vmovdqa64_avx512vl(auVar95._0_32_);
                local_2680 = auVar94._0_32_;
                local_2660 = auVar93._0_32_;
                local_2640 = auVar92._0_32_;
                local_2620 = auVar90._0_32_;
                local_2600 = auVar89._0_32_;
                local_25e0 = auVar88._0_32_;
                uVar33 = (ulong)((uint)local_2800 * 4);
                uVar59 = *(undefined4 *)(local_2480 + uVar33);
                local_2720._4_4_ = uVar59;
                local_2720._0_4_ = uVar59;
                local_2720._8_4_ = uVar59;
                local_2720._12_4_ = uVar59;
                local_2710 = *(undefined4 *)(local_2460 + uVar33);
                local_26f0 = vpbroadcastd_avx512vl();
                uVar59 = *(undefined4 *)((long)&local_2780 + uVar33);
                local_2700._4_4_ = uVar59;
                local_2700._0_4_ = uVar59;
                local_2700._8_4_ = uVar59;
                local_2700._12_4_ = uVar59;
                uVar59 = *(undefined4 *)(local_2420 + uVar33);
                uVar2 = *(undefined4 *)(local_2400 + uVar33);
                local_2740._4_4_ = uVar2;
                local_2740._0_4_ = uVar2;
                local_2740._8_4_ = uVar2;
                local_2740._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_23e0 + uVar33);
                local_2730._4_4_ = uVar2;
                local_2730._0_4_ = uVar2;
                local_2730._8_4_ = uVar2;
                local_2730._12_4_ = uVar2;
                local_2750[0] = (RTCHitN)(char)uVar59;
                local_2750[1] = (RTCHitN)(char)((uint)uVar59 >> 8);
                local_2750[2] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
                local_2750[3] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
                local_2750[4] = (RTCHitN)(char)uVar59;
                local_2750[5] = (RTCHitN)(char)((uint)uVar59 >> 8);
                local_2750[6] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
                local_2750[7] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
                local_2750[8] = (RTCHitN)(char)uVar59;
                local_2750[9] = (RTCHitN)(char)((uint)uVar59 >> 8);
                local_2750[10] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
                local_2750[0xb] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
                local_2750[0xc] = (RTCHitN)(char)uVar59;
                local_2750[0xd] = (RTCHitN)(char)((uint)uVar59 >> 8);
                local_2750[0xe] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
                local_2750[0xf] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
                uStack_270c = local_2710;
                uStack_2708 = local_2710;
                uStack_2704 = local_2710;
                vpcmpeqd_avx2(ZEXT1632(local_2720),ZEXT1632(local_2720));
                uStack_26dc = context->user->instID[0];
                local_26e0 = uStack_26dc;
                uStack_26d8 = uStack_26dc;
                uStack_26d4 = uStack_26dc;
                uStack_26d0 = context->user->instPrimID[0];
                uStack_26cc = uStack_26d0;
                uStack_26c8 = uStack_26d0;
                uStack_26c4 = uStack_26d0;
                uVar59 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar33);
                local_2790 = vmovdqa64_avx512vl(auVar96._0_16_);
                local_2810 = vmovdqa64_avx512vl(auVar96._0_16_);
                local_27c0.valid = (int *)local_2810;
                local_27c0.geometryUserPtr = pGVar8->userPtr;
                local_27c0.context = context->user;
                local_27c0.hit = local_2750;
                local_27c0.N = 4;
                local_2800 = uVar35;
                local_27c0.ray = (RTCRayN *)ray;
                if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar8->intersectionFilterN)(&local_27c0);
                }
                uVar35 = vptestmd_avx512vl(local_2810,local_2810);
                if ((uVar35 & 0xf) == 0) {
LAB_0084db68:
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar59;
                }
                else {
                  p_Var9 = context->args->filter;
                  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var9)(&local_27c0);
                  }
                  uVar35 = vptestmd_avx512vl(local_2810,local_2810);
                  uVar35 = uVar35 & 0xf;
                  bVar34 = (byte)uVar35;
                  if (bVar34 == 0) goto LAB_0084db68;
                  iVar31 = *(int *)(local_27c0.hit + 4);
                  iVar30 = *(int *)(local_27c0.hit + 8);
                  iVar29 = *(int *)(local_27c0.hit + 0xc);
                  bVar12 = (bool)((byte)(uVar35 >> 1) & 1);
                  bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
                  bVar11 = SUB81(uVar35 >> 3,0);
                  *(uint *)(local_27c0.ray + 0xc0) =
                       (uint)(bVar34 & 1) * *(int *)local_27c0.hit |
                       (uint)!(bool)(bVar34 & 1) * *(int *)(local_27c0.ray + 0xc0);
                  *(uint *)(local_27c0.ray + 0xc4) =
                       (uint)bVar12 * iVar31 | (uint)!bVar12 * *(int *)(local_27c0.ray + 0xc4);
                  *(uint *)(local_27c0.ray + 200) =
                       (uint)bVar10 * iVar30 | (uint)!bVar10 * *(int *)(local_27c0.ray + 200);
                  *(uint *)(local_27c0.ray + 0xcc) =
                       (uint)bVar11 * iVar29 | (uint)!bVar11 * *(int *)(local_27c0.ray + 0xcc);
                  iVar31 = *(int *)(local_27c0.hit + 0x14);
                  iVar30 = *(int *)(local_27c0.hit + 0x18);
                  iVar29 = *(int *)(local_27c0.hit + 0x1c);
                  bVar12 = (bool)((byte)(uVar35 >> 1) & 1);
                  bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
                  bVar11 = SUB81(uVar35 >> 3,0);
                  *(uint *)(local_27c0.ray + 0xd0) =
                       (uint)(bVar34 & 1) * *(int *)(local_27c0.hit + 0x10) |
                       (uint)!(bool)(bVar34 & 1) * *(int *)(local_27c0.ray + 0xd0);
                  *(uint *)(local_27c0.ray + 0xd4) =
                       (uint)bVar12 * iVar31 | (uint)!bVar12 * *(int *)(local_27c0.ray + 0xd4);
                  *(uint *)(local_27c0.ray + 0xd8) =
                       (uint)bVar10 * iVar30 | (uint)!bVar10 * *(int *)(local_27c0.ray + 0xd8);
                  *(uint *)(local_27c0.ray + 0xdc) =
                       (uint)bVar11 * iVar29 | (uint)!bVar11 * *(int *)(local_27c0.ray + 0xdc);
                  iVar31 = *(int *)(local_27c0.hit + 0x24);
                  iVar30 = *(int *)(local_27c0.hit + 0x28);
                  iVar29 = *(int *)(local_27c0.hit + 0x2c);
                  bVar12 = (bool)((byte)(uVar35 >> 1) & 1);
                  bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
                  bVar11 = SUB81(uVar35 >> 3,0);
                  *(uint *)(local_27c0.ray + 0xe0) =
                       (uint)(bVar34 & 1) * *(int *)(local_27c0.hit + 0x20) |
                       (uint)!(bool)(bVar34 & 1) * *(int *)(local_27c0.ray + 0xe0);
                  *(uint *)(local_27c0.ray + 0xe4) =
                       (uint)bVar12 * iVar31 | (uint)!bVar12 * *(int *)(local_27c0.ray + 0xe4);
                  *(uint *)(local_27c0.ray + 0xe8) =
                       (uint)bVar10 * iVar30 | (uint)!bVar10 * *(int *)(local_27c0.ray + 0xe8);
                  *(uint *)(local_27c0.ray + 0xec) =
                       (uint)bVar11 * iVar29 | (uint)!bVar11 * *(int *)(local_27c0.ray + 0xec);
                  iVar31 = *(int *)(local_27c0.hit + 0x34);
                  iVar30 = *(int *)(local_27c0.hit + 0x38);
                  iVar29 = *(int *)(local_27c0.hit + 0x3c);
                  bVar12 = (bool)((byte)(uVar35 >> 1) & 1);
                  bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
                  bVar11 = SUB81(uVar35 >> 3,0);
                  *(uint *)(local_27c0.ray + 0xf0) =
                       (uint)(bVar34 & 1) * *(int *)(local_27c0.hit + 0x30) |
                       (uint)!(bool)(bVar34 & 1) * *(int *)(local_27c0.ray + 0xf0);
                  *(uint *)(local_27c0.ray + 0xf4) =
                       (uint)bVar12 * iVar31 | (uint)!bVar12 * *(int *)(local_27c0.ray + 0xf4);
                  *(uint *)(local_27c0.ray + 0xf8) =
                       (uint)bVar10 * iVar30 | (uint)!bVar10 * *(int *)(local_27c0.ray + 0xf8);
                  *(uint *)(local_27c0.ray + 0xfc) =
                       (uint)bVar11 * iVar29 | (uint)!bVar11 * *(int *)(local_27c0.ray + 0xfc);
                  iVar31 = *(int *)(local_27c0.hit + 0x44);
                  iVar30 = *(int *)(local_27c0.hit + 0x48);
                  iVar29 = *(int *)(local_27c0.hit + 0x4c);
                  bVar12 = (bool)((byte)(uVar35 >> 1) & 1);
                  bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
                  bVar11 = SUB81(uVar35 >> 3,0);
                  *(uint *)(local_27c0.ray + 0x100) =
                       (uint)(bVar34 & 1) * *(int *)(local_27c0.hit + 0x40) |
                       (uint)!(bool)(bVar34 & 1) * *(int *)(local_27c0.ray + 0x100);
                  *(uint *)(local_27c0.ray + 0x104) =
                       (uint)bVar12 * iVar31 | (uint)!bVar12 * *(int *)(local_27c0.ray + 0x104);
                  *(uint *)(local_27c0.ray + 0x108) =
                       (uint)bVar10 * iVar30 | (uint)!bVar10 * *(int *)(local_27c0.ray + 0x108);
                  *(uint *)(local_27c0.ray + 0x10c) =
                       (uint)bVar11 * iVar29 | (uint)!bVar11 * *(int *)(local_27c0.ray + 0x10c);
                  auVar41 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_27c0.hit + 0x50));
                  *(undefined1 (*) [16])(local_27c0.ray + 0x110) = auVar41;
                  auVar41 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_27c0.hit + 0x60));
                  *(undefined1 (*) [16])(local_27c0.ray + 0x120) = auVar41;
                  auVar41 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_27c0.hit + 0x70));
                  *(undefined1 (*) [16])(local_27c0.ray + 0x130) = auVar41;
                  auVar41 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_27c0.hit + 0x80));
                  *(undefined1 (*) [16])(local_27c0.ray + 0x140) = auVar41;
                }
                auVar62 = ZEXT3264(local_26c0);
                uVar59 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar25._4_4_ = uVar59;
                auVar25._0_4_ = uVar59;
                auVar25._8_4_ = uVar59;
                auVar25._12_4_ = uVar59;
                auVar25._16_4_ = uVar59;
                auVar25._20_4_ = uVar59;
                auVar25._24_4_ = uVar59;
                auVar25._28_4_ = uVar59;
                uVar35 = vcmpps_avx512vl(local_26c0,auVar25,2);
                uVar40 = (byte)(~(byte)(1 << ((uint)local_2800 & 0x1f)) & (byte)uVar40) & uVar35;
                bVar12 = true;
                auVar88 = ZEXT3264(local_25e0);
                auVar89 = ZEXT3264(local_2600);
                auVar90 = ZEXT3264(local_2620);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar91 = ZEXT3264(auVar43);
                auVar92 = ZEXT3264(local_2640);
                auVar93 = ZEXT3264(local_2660);
                auVar94 = ZEXT3264(local_2680);
                auVar43 = vmovdqa64_avx512vl(local_26a0);
                auVar95 = ZEXT3264(auVar43);
                auVar41 = vmovdqa64_avx512vl(local_2790);
                auVar96 = ZEXT1664(auVar41);
                auVar43 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                auVar97 = ZEXT3264(auVar43);
                auVar43 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                auVar98 = ZEXT3264(auVar43);
                auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
                auVar99 = ZEXT1664(auVar41);
                auVar43 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                auVar100 = ZEXT3264(auVar43);
              }
              if (!bVar12) {
                uVar40 = (ulong)((uint)local_2800 << 2);
                uVar59 = *(undefined4 *)(local_2480 + uVar40);
                uVar2 = *(undefined4 *)(local_2460 + uVar40);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar40);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2420 + uVar40);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2400 + uVar40);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_23e0 + uVar40);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar59;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_2780 + uVar40);
                *(uint *)(ray + k * 4 + 0x120) = uVar77;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                break;
              }
              bVar34 = (byte)uVar40;
              if (bVar34 == 0) break;
              auVar61._8_4_ = 0x7f800000;
              auVar61._0_8_ = 0x7f8000007f800000;
              auVar61._12_4_ = 0x7f800000;
              auVar61._16_4_ = 0x7f800000;
              auVar61._20_4_ = 0x7f800000;
              auVar61._24_4_ = 0x7f800000;
              auVar61._28_4_ = 0x7f800000;
              auVar43 = vblendmps_avx512vl(auVar61,auVar62._0_32_);
              auVar58._0_4_ =
                   (uint)(bVar34 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar34 & 1) * 0x7f800000;
              bVar12 = (bool)((byte)(uVar40 >> 1) & 1);
              auVar58._4_4_ = (uint)bVar12 * auVar43._4_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)((byte)(uVar40 >> 2) & 1);
              auVar58._8_4_ = (uint)bVar12 * auVar43._8_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)((byte)(uVar40 >> 3) & 1);
              auVar58._12_4_ = (uint)bVar12 * auVar43._12_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)((byte)(uVar40 >> 4) & 1);
              auVar58._16_4_ = (uint)bVar12 * auVar43._16_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)((byte)(uVar40 >> 5) & 1);
              auVar58._20_4_ = (uint)bVar12 * auVar43._20_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)((byte)(uVar40 >> 6) & 1);
              auVar58._24_4_ = (uint)bVar12 * auVar43._24_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = SUB81(uVar40 >> 7,0);
              auVar58._28_4_ = (uint)bVar12 * auVar43._28_4_ | (uint)!bVar12 * 0x7f800000;
              auVar43 = vshufps_avx(auVar58,auVar58,0xb1);
              auVar43 = vminps_avx(auVar58,auVar43);
              auVar44 = vshufpd_avx(auVar43,auVar43,5);
              auVar43 = vminps_avx(auVar43,auVar44);
              auVar44 = vpermpd_avx2(auVar43,0x4e);
              auVar43 = vminps_avx(auVar43,auVar44);
              uVar22 = vcmpps_avx512vl(auVar58,auVar43,0);
              bVar34 = (byte)uVar22 & bVar34;
            } while( true );
          }
        }
        lVar38 = lVar38 + 1;
      } while (lVar38 != local_27c8);
    }
    uVar59 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar62 = ZEXT3264(CONCAT428(uVar59,CONCAT424(uVar59,CONCAT420(uVar59,CONCAT416(uVar59,CONCAT412
                                                  (uVar59,CONCAT48(uVar59,CONCAT44(uVar59,uVar59))))
                                                  ))));
    in_ZMM8 = ZEXT3264(local_25c0);
    uVar40 = local_27d8;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }